

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

double * cheby_t_poly_coef(int n)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  if (n < 0) {
    return (double *)0x0;
  }
  uVar8 = (ulong)(uint)n;
  uVar1 = uVar8 + 1;
  pdVar2 = (double *)operator_new__((ulong)(uint)((n + 1) * (n + 1)) << 3);
  pdVar4 = pdVar2;
  for (uVar3 = 0; pdVar5 = pdVar4, uVar6 = uVar1, uVar3 != uVar1; uVar3 = uVar3 + 1) {
    while (uVar6 != 0) {
      *pdVar5 = 0.0;
      pdVar5 = pdVar5 + uVar8 + 1;
      uVar6 = uVar6 - 1;
    }
    pdVar4 = pdVar4 + 1;
  }
  *pdVar2 = 1.0;
  if (n != 0) {
    pdVar2[uVar8 + 2] = 1.0;
    lVar7 = 0;
    pdVar4 = pdVar2;
    for (uVar3 = 2; pdVar4 = pdVar4 + 1, uVar3 != uVar1; uVar3 = uVar3 + 1) {
      pdVar2[uVar3] = -pdVar2[uVar3 - 2];
      pdVar5 = pdVar4;
      lVar9 = lVar7;
      while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
        pdVar5[uVar8 + 2] = (*pdVar5 + *pdVar5) - pdVar5[uVar8];
        pdVar5 = pdVar5 + uVar1;
      }
      lVar9 = (uVar3 - 1) * (uVar1 & 0xffffffff);
      pdVar2[lVar9 + uVar3] =
           pdVar2[(uVar3 - 2) * (uVar1 & 0xffffffff) + (uVar3 - 1)] +
           pdVar2[(uVar3 - 2) * (uVar1 & 0xffffffff) + (uVar3 - 1)];
      pdVar2[(n + 2) * (int)uVar3] = pdVar2[lVar9 + (uVar3 - 1)] + pdVar2[lVar9 + (uVar3 - 1)];
      lVar7 = lVar7 + 1;
    }
  }
  return pdVar2;
}

Assistant:

double *cheby_t_poly_coef ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBY_T_POLY_COEF evaluates coefficients of Chebyshev polynomials T(n,x).
//
//  First terms:
//
//    N/K     0     1      2      3       4     5      6    7      8    9   10
//
//     0      1
//     1      0     1
//     2     -1     0      2
//     3      0    -3      0      4
//     4      1     0     -8      0       8
//     5      0     5      0    -20       0    16
//     6     -1     0     18      0     -48     0     32
//     7      0    -7      0     56       0  -112      0    64
//
//  Recursion:
//
//    T(0,X) = 1,
//    T(1,X) = X,
//    T(N,X) = 2 * X * T(N-1,X) - T(N-2,X)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    22 April 2012
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Output, double CHEBY_T_POLY_COEF[(N+1)*(N+1)], the coefficients of 
//    the Chebyshev T polynomials.
//
{
  double *c;
  int i;
  int j;

  if ( n < 0 )
  {
    return NULL;
  }

  c = new double[(n+1)*(n+1)];

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  c[0+0*(n+1)] = 1.0;

  if ( n == 0 )
  {
    return c;
  }

  c[1+1*(n+1)] = 1.0;

  for ( i = 2; i <= n; i++ )
  {
    c[i+0*(n+1)]     =                    - c[i-2+0*(n+1)];
    for ( j = 1; j <= i - 2; j++ )
    {
      c[i+j*(n+1)] = 2.0 * c[i-1+(j-1)*(n+1)] - c[i-2+j*(n+1)];
    }
    c[i+(i-1)*(n+1)] = 2.0 * c[i-1+(i-2)*(n+1)];
    c[i+ i   *(n+1)] = 2.0 * c[i-1+(i-1)*(n+1)];
  }

  return c;
}